

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-ignore.c
# Opt level: O0

ignore_type_t ignore_type_of(object *obj)

{
  char *pcVar1;
  ulong local_20;
  size_t i;
  object *obj_local;
  
  local_20 = 0;
  while( true ) {
    if (0x23 < local_20) {
      return ITYPE_MAX;
    }
    if ((quality_mapping[local_20].tval == (uint)obj->tval) &&
       ((*quality_mapping[local_20].identifier == '\0' ||
        (pcVar1 = strstr(obj->kind->name,quality_mapping[local_20].identifier),
        pcVar1 != (char *)0x0)))) break;
    local_20 = local_20 + 1;
  }
  return quality_mapping[local_20].ignore_type;
}

Assistant:

ignore_type_t ignore_type_of(const struct object *obj)
{
	size_t i;

	/* Find the appropriate ignore group */
	for (i = 0; i < N_ELEMENTS(quality_mapping); i++) {
		if (quality_mapping[i].tval == obj->tval) {
			/* If there's an identifier, it must match */
			if (quality_mapping[i].identifier[0]) {
				if (!strstr(obj->kind->name, quality_mapping[i].identifier))
					continue;
			}
			/* Otherwise we're fine */
			return quality_mapping[i].ignore_type;
		}
	}

	return ITYPE_MAX;
}